

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O3

wostream * mjs::operator<<(wostream *os,declaration *d)

{
  long *plVar1;
  size_type sVar2;
  expression *peVar3;
  undefined4 uVar4;
  undefined8 in_RAX;
  wostream *pwVar5;
  undefined8 local_18;
  
  plVar1 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
  local_18 = in_RAX;
  if (plVar1 == (long *)0x0) goto LAB_0017a8b9;
  uVar4 = (**(code **)(*plVar1 + 0x50))(plVar1,0x7b);
  local_18 = CONCAT44(local_18._4_4_,uVar4);
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,(wchar_t *)&local_18,1);
  sVar2 = (d->id_)._M_string_length;
  pwVar5 = os;
  if (sVar2 == 0) {
LAB_0017a875:
    peVar3 = (d->init_)._M_t.
             super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
             super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
             super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
    (**(code **)((long)(peVar3->super_syntax_node)._vptr_syntax_node + 0x10))(peVar3,pwVar5);
  }
  else {
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,(d->id_)._M_dataplus._M_p,sVar2);
    if ((d->init_)._M_t.
        super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
        super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
        super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl != (expression *)0x0) {
      pwVar5 = std::operator<<(os,", ");
      goto LAB_0017a875;
    }
  }
  plVar1 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
  if (plVar1 != (long *)0x0) {
    uVar4 = (**(code **)(*plVar1 + 0x50))(plVar1,0x7d);
    local_18 = CONCAT44(uVar4,(wchar_t)local_18);
    pwVar5 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                       (os,(wchar_t *)((long)&local_18 + 4),1);
    return pwVar5;
  }
LAB_0017a8b9:
  std::__throw_bad_cast();
}

Assistant:

std::wostream& operator<<(std::wostream& os, const declaration& d) {
        os << '{';
        if (!d.id_.empty()) {
            os << d.id_;
            if (d.init_) {
                os << ", " << *d.init_;
            }
        } else {
            os << *d.init_;
        }
        return os << '}';
    }